

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

void __thiscall
QAccessibleLineEdit::replaceText
          (QAccessibleLineEdit *this,int startOffset,int endOffset,QString *text)

{
  QLineEdit *this_00;
  int in_EDX;
  int in_ESI;
  QLineEdit *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffa8;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = lineEdit((QAccessibleLineEdit *)0x7f14c7);
  lineEdit((QAccessibleLineEdit *)0x7f14d6);
  QLineEdit::text(this_00);
  QString::replace((longlong)local_20,(long)in_ESI,(QString *)(long)(in_EDX - in_ESI));
  QLineEdit::setText(in_RDI,in_stack_ffffffffffffffa8);
  QString::~QString((QString *)0x7f151e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAccessibleLineEdit::replaceText(int startOffset, int endOffset, const QString &text)
{
    lineEdit()->setText(lineEdit()->text().replace(startOffset, endOffset - startOffset, text));
}